

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O1

size_t __thiscall rcg::Buffer::getXOffset(Buffer *this,uint32_t part)

{
  GC_ERROR GVar1;
  void *pvVar2;
  unsigned_long ret;
  size_t size;
  INFO_DATATYPE type;
  size_t local_28 [2];
  INFO_DATATYPE local_14;
  
  if (this->multipart == true) {
    pvVar2 = Stream::getHandle(this->parent);
    local_28[0] = 0;
    local_28[1] = 8;
    if (this->buffer != (BUFFER_HANDLE)0x0 && pvVar2 != (void *)0x0) {
      (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->DSGetBufferPartInfo)(pvVar2,this->buffer,part,7,&local_14,local_28,local_28 + 1);
    }
  }
  else if ((this->payload_type == 4) &&
          ((this->nodemap).super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr != (element_type *)0x0)) {
    local_28[0] = getInteger(&this->nodemap,"ChunkOffsetX",(int64_t *)0x0,(int64_t *)0x0,true,false)
    ;
  }
  else {
    pvVar2 = Stream::getHandle(this->parent);
    local_28[0] = 0;
    local_28[1] = 8;
    if ((this->buffer != (BUFFER_HANDLE)0x0 && pvVar2 != (void *)0x0) &&
       (GVar1 = (*((this->gentl).
                   super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  DSGetBufferInfo)(pvVar2,this->buffer,0xc,&local_14,local_28,local_28 + 1),
       GVar1 != 0)) {
      local_28[0] = 0;
    }
  }
  return local_28[0];
}

Assistant:

size_t Buffer::getXOffset(uint32_t part) const
{
  if (multipart)
  {
    return getBufferPartValue<size_t>(gentl, parent->getHandle(), buffer, part,
                                      GenTL::BUFFER_PART_INFO_XOFFSET);
  }
  else
  {
    if (payload_type == PAYLOAD_TYPE_CHUNK_DATA && nodemap)
    {
      try
      {
        return getInteger(nodemap, "ChunkOffsetX", 0, 0, true);
      }
      catch (const std::exception &)
      {
        // ignore error and try getBufferValue()
      }
    }

    return getBufferValue<size_t>(gentl, parent->getHandle(), buffer, GenTL::BUFFER_INFO_XOFFSET);
  }
}